

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::gil_scoped_acquire::gil_scoped_acquire(gil_scoped_acquire *this)

{
  internals *piVar1;
  PyThreadState *pPVar2;
  internals *internals;
  gil_scoped_acquire *this_local;
  
  this->tstate = (PyThreadState *)0x0;
  this->release = true;
  piVar1 = detail::get_internals();
  pPVar2 = (PyThreadState *)PyThread_get_key_value(piVar1->tstate);
  this->tstate = pPVar2;
  if (this->tstate == (PyThreadState *)0x0) {
    pPVar2 = (PyThreadState *)PyThreadState_New(piVar1->istate);
    this->tstate = pPVar2;
    if (this->tstate == (PyThreadState *)0x0) {
      pybind11_fail("scoped_acquire: could not create thread state!");
    }
    this->tstate->gilstate_counter = 0;
    PyThread_set_key_value(piVar1->tstate,this->tstate);
  }
  else {
    pPVar2 = detail::get_thread_state_unchecked();
    this->release = pPVar2 != this->tstate;
  }
  if ((this->release & 1U) != 0) {
    PyEval_AcquireThread(this->tstate);
  }
  inc_ref(this);
  return;
}

Assistant:

PYBIND11_NOINLINE gil_scoped_acquire() {
        auto const &internals = detail::get_internals();
        tstate = (PyThreadState *) PyThread_get_key_value(internals.tstate);

        if (!tstate) {
            tstate = PyThreadState_New(internals.istate);
            #if !defined(NDEBUG)
                if (!tstate)
                    pybind11_fail("scoped_acquire: could not create thread state!");
            #endif
            tstate->gilstate_counter = 0;
            #if PY_MAJOR_VERSION < 3
                PyThread_delete_key_value(internals.tstate);
            #endif
            PyThread_set_key_value(internals.tstate, tstate);
        } else {
            release = detail::get_thread_state_unchecked() != tstate;
        }

        if (release) {
            /* Work around an annoying assertion in PyThreadState_Swap */
            #if defined(Py_DEBUG)
                PyInterpreterState *interp = tstate->interp;
                tstate->interp = nullptr;
            #endif
            PyEval_AcquireThread(tstate);
            #if defined(Py_DEBUG)
                tstate->interp = interp;
            #endif
        }

        inc_ref();
    }